

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::initializeParam(VariationalBayesEstimatorOnLDA *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer *ppvVar1;
  pointer pvVar2;
  pointer pvVar3;
  void *pvVar4;
  pointer pdVar5;
  pointer pvVar6;
  pointer pdVar7;
  double dVar8;
  uint uVar9;
  ulong uVar10;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar11;
  ulong uVar12;
  pointer pvVar13;
  size_t __i;
  double *pdVar14;
  double *pdVar15;
  uint *puVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  vector<double,_std::allocator<double>_> ndkSum;
  random_device rnd;
  mt19937 mt;
  allocator_type local_2789;
  vector<double,_std::allocator<double>_> local_2788;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2768;
  vector<double,_std::allocator<double>_> *local_2750;
  ulong local_2748;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  pvVar13 = (this->_thetaEx).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_thetaEx).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_K,
                 (value_type_conflict2 *)&local_2740);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_thetaEx).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_thetaEx).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  pvVar13 = (this->_phiEx).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_phiEx).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_V,
                 (value_type_conflict2 *)&local_2740);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_phiEx).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_phiEx).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  pvVar13 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_K,
                 (value_type_conflict2 *)&local_2740);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_ndk).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  pvVar13 = (this->_nkv).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_V,
                 (value_type_conflict2 *)&local_2740);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_nkv).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  this_00 = &this->_nk;
  local_2740.field_0._M_file = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (this_00,(ulong)this->_K,(value_type_conflict2 *)&local_2740);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar9 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar9;
  lVar21 = 1;
  uVar20 = local_13b8._M_x[0];
  do {
    uVar20 = (ulong)(((uint)(uVar20 >> 0x1e) ^ (uint)uVar20) * 0x6c078965 + (int)lVar21);
    local_13b8._M_x[lVar21] = uVar20;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x270);
  local_13b8._M_p = 0x270;
  pvVar11 = this->_docVoca;
  local_2750 = this_00;
  if ((pvVar11->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar11->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar20 = 0;
    do {
      pvVar2 = (pvVar11->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_2768,
               (long)*(pointer *)
                      ((long)&pvVar2[uVar20].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar2[uVar20].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data >> 2,&local_2789);
      pvVar3 = (this->_qz).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = *(pointer *)
                   &pvVar3[uVar20].
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data;
      ppvVar1 = (pointer *)
                ((long)&pvVar3[uVar20].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)*ppvVar1;
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)ppvVar1[1];
      pvVar3[uVar20].
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&pvVar3[uVar20].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&pvVar3[uVar20].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2748 = uVar20;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_2788);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_2768);
      pvVar2 = (this->_docVoca->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[uVar20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) !=
          pvVar2[uVar20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_2788,(ulong)this->_K,(allocator_type *)&local_2768);
          lVar21 = *(long *)&(this->_qz).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar20].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          pvVar4 = *(void **)(lVar21 + uVar10 * 0x18);
          *(pointer *)(lVar21 + uVar10 * 0x18) =
               local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)(lVar21 + 8 + uVar10 * 0x18) =
               local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)(lVar21 + 0x10 + uVar10 * 0x18) =
               local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4);
          }
          if (local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar12 = (ulong)this->_K;
          if (this->_K != 0) {
            uVar22 = 0;
            do {
              dVar8 = std::
                      generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                (&local_13b8);
              *(double *)
               (*(long *)(*(long *)&(this->_qz).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar20].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar10 * 0x18) + uVar22 * 8)
                   = dVar8 + 0.0;
              uVar22 = uVar22 + 1;
              uVar12 = (ulong)this->_K;
            } while (uVar22 < uVar12);
          }
          lVar21 = *(long *)&(this->_qz).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar20].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          dVar8 = 0.0;
          pdVar14 = *(double **)(lVar21 + uVar10 * 0x18);
          for (pdVar15 = pdVar14; pdVar15 != *(double **)(lVar21 + 8 + uVar10 * 0x18);
              pdVar15 = pdVar15 + 1) {
            dVar8 = dVar8 + *pdVar15;
          }
          if ((int)uVar12 != 0) {
            uVar22 = 0;
            do {
              pdVar14[uVar22] = pdVar14[uVar22] / dVar8;
              uVar22 = uVar22 + 1;
            } while (uVar12 != uVar22);
          }
          uVar10 = uVar10 + 1;
          pvVar2 = (this->_docVoca->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar20].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar2[uVar20].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data >> 2));
      }
      pvVar11 = this->_docVoca;
      uVar20 = local_2748 + 1;
      uVar10 = ((long)(pvVar11->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar11->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_nd,(ulong)this->_D,(value_type_conflict2 *)&local_2788);
  uVar9 = this->_D;
  if ((ulong)uVar9 != 0) {
    pdVar5 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (this->_frequencyMatrix->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar20 = 0;
    do {
      dVar8 = 0.0;
      for (puVar16 = pvVar2[uVar20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          puVar16 !=
          *(pointer *)
           ((long)&pvVar2[uVar20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8); puVar16 = puVar16 + 1) {
        dVar8 = dVar8 + (double)*puVar16;
      }
      pdVar5[uVar20] = dVar8;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar9);
  }
  pvVar13 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_K,
                 (value_type_conflict2 *)&local_2788);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_ndk).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  if ((this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar20 = 0;
    do {
      pvVar13 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar13[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar13[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          dVar8 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            (&local_13b8);
          pvVar13 = (this->_ndk).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           (*(long *)&pvVar13[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar10 * 8) = dVar8 + 0.0;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar13[uVar20].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar13[uVar20].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data >> 3));
      }
      uVar20 = uVar20 + 1;
      uVar10 = ((long)(this->_ndk).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_ndk).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  local_2768.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2788,(ulong)this->_D,(value_type_conflict2 *)&local_2768,
             (allocator_type *)&local_2789);
  pvVar13 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->_ndk).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar21 = ((long)pvVar6 - (long)pvVar13 >> 3) * -0x5555555555555555;
  if (pvVar6 != pvVar13) {
    lVar17 = 0;
    do {
      dVar8 = 0.0;
      for (pdVar14 = pvVar13[lVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar14 !=
          pvVar13[lVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
        dVar8 = dVar8 + *pdVar14;
      }
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar17] = dVar8;
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar21 + (ulong)(lVar21 == 0));
  }
  if (pvVar6 != pvVar13) {
    pdVar5 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      pdVar7 = pvVar13[lVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = (long)pvVar13[lVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar7;
      if (lVar18 != 0) {
        lVar18 = lVar18 >> 3;
        lVar19 = 0;
        do {
          pdVar7[lVar19] =
               pdVar7[lVar19] /
               (local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17] / pdVar5[lVar17]);
          lVar19 = lVar19 + 1;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar19);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar21 + (ulong)(lVar21 == 0));
  }
  pvVar13 = (this->_nkv).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar13) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)this->_V,
                 (value_type_conflict2 *)&local_2768);
      uVar20 = uVar20 + 1;
      pvVar13 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_nkv).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
      lVar21 = lVar21 + 0x18;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  pvVar13 = (this->_nkv).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar13) {
    uVar20 = 0;
  }
  else {
    uVar10 = 0;
    do {
      pvVar13 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar20 = 0;
        do {
          dVar8 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            (&local_13b8);
          pvVar13 = (this->_nkv).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           (*(long *)&pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar20 * 8) = dVar8 + 0.0;
          uVar20 = uVar20 + 1;
        } while (uVar20 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar13[uVar10].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar13[uVar10].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data >> 3));
      }
      uVar10 = uVar10 + 1;
      pvVar13 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = ((long)(this->_nkv).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
               -0x5555555555555555;
    } while (uVar10 <= uVar20 && uVar20 - uVar10 != 0);
  }
  dVar23 = 0.0;
  dVar8 = 0.0;
  if (uVar20 != 0) {
    uVar10 = 0;
    dVar8 = 0.0;
    do {
      dVar24 = 0.0;
      for (pdVar14 = pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar14 !=
          pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
        dVar24 = dVar24 + *pdVar14;
      }
      dVar8 = dVar8 + dVar24;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar20);
  }
  pdVar14 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar15 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pdVar14 != pdVar15) {
    dVar23 = 0.0;
    do {
      dVar23 = dVar23 + *pdVar14;
      pdVar14 = pdVar14 + 1;
    } while (pdVar14 != pdVar15);
  }
  if (uVar20 != 0) {
    uVar10 = 0;
    do {
      pdVar5 = pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar21 = (long)pvVar13[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar5;
      if (lVar21 != 0) {
        lVar21 = lVar21 >> 3;
        lVar17 = 0;
        do {
          pdVar5[lVar17] = pdVar5[lVar17] / (dVar8 / dVar23);
          lVar17 = lVar17 + 1;
        } while (lVar21 + (ulong)(lVar21 == 0) != lVar17);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar20);
  }
  local_2768.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_2750,(ulong)this->_K,(value_type_conflict2 *)&local_2768);
  uVar9 = this->_K;
  if ((ulong)uVar9 != 0) {
    pdVar5 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar13 = (this->_nkv).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = 0;
    do {
      dVar8 = 0.0;
      for (pdVar14 = pvVar13[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar14 !=
          *(pointer *)
           ((long)&pvVar13[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8); pdVar14 = pdVar14 + 1) {
        dVar8 = dVar8 + *pdVar14;
      }
      pdVar5[uVar20] = dVar8;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar9);
  }
  if (local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeParam(){//{{{
    for(int d=0; d<_thetaEx.size(); d++)_thetaEx[d].assign(_K, 0);
    for(int k=0; k<_phiEx.size(); k++)_phiEx[k].assign(_V, 0);
    for(int d=0; d<_ndk.size(); d++)_ndk[d].assign(_K, 0);
    for(int k=0; k<_nkv.size(); k++)_nkv[k].assign(_V, 0);
    _nk.assign(_K, 0);

    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0, 1);
    for(int d=0; d<_docVoca.size(); d++){
        _qz[d] = vector<vector<double> >(_docVoca[d].size());
        for(int l=0; l<_docVoca[d].size(); l++){
            _qz[d][l] = vector<double>(_K);
            for(int k=0; k<_K; k++){
                double randomValue = randN(mt);
                _qz[d][l][k] = randomValue;
            }
            double qzSum = accumulate(_qz[d][l].begin(), _qz[d][l].end(), 0.0);
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= qzSum;
            }
        }
    }

    _nd.assign(_D, 0);
    for(int d=0;d<_D;d++){
        _nd[d] = accumulate(_frequencyMatrix[d].begin(), _frequencyMatrix[d].end(), 0.0);
    }

    for(int d=0;d<_ndk.size();d++)_ndk[d].assign(_K, 0);
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            double randomValue=randN(mt);
            _ndk[d][k] = randomValue;
        }
    }
    vector<double> ndkSum(_D, 0);
    for(int d=0;d<_ndk.size();d++){
        ndkSum[d] = accumulate(_ndk[d].begin(), _ndk[d].end(), 0.0);
    }
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            _ndk[d][k] /= ndkSum[d]/_nd[d];
        }
    }

    for(int k=0;k<_nkv.size();k++)_nkv[k].assign(_V, 0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            double randomValue=randN(mt);
            _nkv[k][v] = randomValue;
        }
    }
    double Z = 0;
    for(int k=0;k<_nkv.size();k++){
        Z += accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }
    double wordCount = accumulate(_nd.begin(), _nd.end(), 0.0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            _nkv[k][v] /= Z/wordCount;
        }
    }

    _nk.assign(_K, 0);
    for(int k=0;k<_K;k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }

}